

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_object.cpp
# Opt level: O0

void __thiscall
mjs::function_object::function_object
          (function_object *this,gc_heap_ptr<mjs::global_object> *global,string *class_name,
          object_ptr *prototype)

{
  bool bVar1;
  property_attribute pVar2;
  version vVar3;
  global_object *pgVar4;
  string local_38;
  object_ptr *local_28;
  object_ptr *prototype_local;
  string *class_name_local;
  gc_heap_ptr<mjs::global_object> *global_local;
  function_object *this_local;
  
  local_28 = prototype;
  prototype_local = (object_ptr *)class_name;
  class_name_local = (string *)global;
  global_local = (gc_heap_ptr<mjs::global_object> *)this;
  native_object::native_object(&this->super_native_object,class_name,prototype);
  (this->super_native_object).super_object._vptr_object = (_func_int **)&PTR_get_00298168;
  gc_heap_ptr_untracked<mjs::global_object,_true>::gc_heap_ptr_untracked
            ((gc_heap_ptr_untracked<mjs::global_object,_true> *)
             &(this->super_native_object).field_0x24,
             (gc_heap_ptr<mjs::global_object> *)class_name_local);
  gc_heap_ptr_untracked<mjs::gc_function,_true>::gc_heap_ptr_untracked(&this->construct_);
  gc_heap_ptr_untracked<mjs::gc_function,_true>::gc_heap_ptr_untracked(&this->call_);
  gc_heap_ptr_untracked<mjs::gc_string,_true>::gc_heap_ptr_untracked(&this->text_);
  value_representation::value_representation(&this->prototype_prop_,(value *)value::null);
  this->named_args_ = 0;
  this->is_native_ = false;
  pVar2 = operator|(dont_enum,dont_delete);
  pVar2 = operator|(pVar2,read_only);
  native_object::
  add_native_property<mjs::function_object,_&mjs::function_object::get_length,_nullptr>
            (&this->super_native_object,"length",pVar2);
  pVar2 = operator|(dont_enum,dont_delete);
  native_object::
  add_native_property<mjs::function_object,_&mjs::function_object::get_prototype,_&mjs::function_object::put_prototype>
            (&this->super_native_object,"prototype",pVar2);
  pgVar4 = gc_heap_ptr<mjs::global_object>::operator->
                     ((gc_heap_ptr<mjs::global_object> *)class_name_local);
  vVar3 = global_object::language_version(pgVar4);
  if ((int)vVar3 < 2) {
    pgVar4 = gc_heap_ptr<mjs::global_object>::operator->
                       ((gc_heap_ptr<mjs::global_object> *)class_name_local);
    (*(pgVar4->super_object)._vptr_object[0x13])(&local_38,pgVar4,"arguments");
    pVar2 = operator|(dont_delete,dont_enum);
    pVar2 = operator|(pVar2,read_only);
    object::redefine_own_property((object *)this,&local_38,(value *)value::null,pVar2);
    string::~string(&local_38);
  }
  else {
    pgVar4 = gc_heap_ptr<mjs::global_object>::operator->
                       ((gc_heap_ptr<mjs::global_object> *)class_name_local);
    bVar1 = global_object::strict_mode(pgVar4);
    if (bVar1) {
      pgVar4 = gc_heap_ptr<mjs::global_object>::operator->
                         ((gc_heap_ptr<mjs::global_object> *)class_name_local);
      (*(pgVar4->super_object)._vptr_object[0x12])(pgVar4,this,"arguments");
      pgVar4 = gc_heap_ptr<mjs::global_object>::operator->
                         ((gc_heap_ptr<mjs::global_object> *)class_name_local);
      (*(pgVar4->super_object)._vptr_object[0x12])(pgVar4,this,"caller");
    }
  }
  return;
}

Assistant:

function_object::function_object(const gc_heap_ptr<global_object>& global, const string& class_name, const object_ptr& prototype)
    : native_object(class_name, prototype)
    , global_(global)
    , prototype_prop_(value_representation{value::null}) {
    DEFINE_NATIVE_PROPERTY_READONLY(function_object, length);
    DEFINE_NATIVE_PROPERTY(function_object, prototype);
    if (global->language_version() < version::es5) {
        object::redefine_own_property(global->common_string("arguments"), value::null, property_attribute::dont_delete|property_attribute::dont_enum|property_attribute::read_only);
    } else {
        if (global->strict_mode()) {
            global->define_thrower_accessor(*this, "arguments");
            global->define_thrower_accessor(*this, "caller");
        }
    }

    static_assert(!gc_type_info_registration<function_object>::needs_destroy);
    static_assert(gc_type_info_registration<function_object>::needs_fixup);
}